

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

bool __thiscall
cmCacheManager::LoadCache
          (cmCacheManager *this,string *path,bool internal,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  iterator iVar5;
  mapped_type *this_00;
  ostream *poVar6;
  cmValue cVar7;
  undefined7 in_register_00000011;
  cmCacheManager *this_01;
  _Alloc_hider __s;
  string helpString;
  CacheEntry e;
  string entryKey;
  string oldcwd;
  string buffer;
  string cacheFile;
  ostringstream error;
  string local_258;
  ifstream fin;
  byte abStack_218 [488];
  
  _fin = path->_M_string_length;
  _error = (pointer)0xf;
  cmStrCat<>(&cacheFile,(cmAlphaNum *)&fin,(cmAlphaNum *)&error);
  if ((int)CONCAT71(in_register_00000011,internal) != 0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
             *)this);
  }
  this_01 = (cmCacheManager *)&cacheFile;
  bVar1 = cmsys::SystemTools::FileExists((string *)this_01);
  if (bVar1) {
    std::ifstream::ifstream(&fin,cacheFile._M_dataplus._M_p,_S_in);
    bVar1 = (abStack_218[*(long *)(_fin - 0x18)] & 5) == 0;
    if (bVar1) {
      buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
      buffer._M_string_length = 0;
      entryKey._M_dataplus._M_p = (pointer)&entryKey.field_2;
      entryKey._M_string_length = 0;
      buffer.field_2._M_local_buf[0] = '\0';
      entryKey.field_2._M_local_buf[0] = '\0';
      while ((abStack_218[*(long *)(_fin - 0x18)] & 5) == 0) {
        helpString._M_dataplus._M_p = (pointer)&helpString.field_2;
        helpString._M_string_length = 0;
        helpString.field_2._M_local_buf[0] = '\0';
        e.Value._M_dataplus._M_p = (pointer)&e.Value.field_2;
        e.Value._M_string_length = 0;
        e.Value.field_2._M_local_buf[0] = '\0';
        e.Type = UNINITIALIZED;
        e.Properties.Map_._M_h._M_buckets = &e.Properties.Map_._M_h._M_single_bucket;
        e.Properties.Map_._M_h._M_bucket_count = 1;
        e.Properties.Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        e.Properties.Map_._M_h._M_element_count = 0;
        e.Properties.Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        e.Initialized = false;
        e.Properties.Map_._M_h._M_rehash_policy._M_next_resize = 0;
        e.Properties.Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
        cmsys::SystemTools::GetLineFromStream
                  ((istream *)&fin,&buffer,(bool *)0x0,0xffffffffffffffff);
        for (__s = buffer._M_dataplus; uVar4 = (ulong)(byte)*__s._M_p, uVar4 < 0x24;
            __s._M_p = __s._M_p + 1) {
          if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
            if ((0x800000001U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_0031ce52;
            break;
          }
        }
        while (((char)uVar4 == '/' && (((byte *)__s._M_p)[1] == 0x2f))) {
          if ((((byte *)__s._M_p)[2] == 0x5c) && (((byte *)__s._M_p)[3] == 0x6e)) {
            std::__cxx11::string::push_back((char)&helpString);
          }
          std::__cxx11::string::append((char *)&helpString);
          cmsys::SystemTools::GetLineFromStream
                    ((istream *)&fin,&buffer,(bool *)0x0,0xffffffffffffffff);
          uVar4 = (ulong)(byte)*buffer._M_dataplus._M_p;
          __s = buffer._M_dataplus;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,"HELPSTRING",(allocator<char> *)&oldcwd);
        CacheEntry::SetProperty(&e,(string *)&error,helpString._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&error);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,__s._M_p,(allocator<char> *)&oldcwd);
        bVar2 = cmState::ParseCacheEntry((string *)&error,&entryKey,&e.Value,&e.Type);
        std::__cxx11::string::~string((string *)&error);
        if (bVar2) {
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&excludes->_M_t,&entryKey);
          if ((_Rb_tree_header *)iVar5._M_node == &(excludes->_M_t)._M_impl.super__Rb_tree_header) {
            if ((!internal) && (e.Type == INTERNAL)) {
              iVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&includes->_M_t,&entryKey);
              if ((_Rb_tree_header *)iVar5._M_node ==
                  &(includes->_M_t)._M_impl.super__Rb_tree_header) goto LAB_0031ce52;
            }
            if (!internal) {
              e.Type = INTERNAL;
              _error = (pointer)0xd;
              oldcwd._M_dataplus._M_p = (pointer)entryKey._M_string_length;
              oldcwd._M_string_length = (size_type)entryKey._M_dataplus._M_p;
              cmStrCat<char[67],std::__cxx11::string,char[16]>
                        (&local_258,(cmAlphaNum *)&error,(cmAlphaNum *)&oldcwd,
                         (char (*) [67])
                         " loaded from external file.  To change this value edit this file: ",path,
                         (char (*) [16])"/CMakeCache.txt");
              std::__cxx11::string::operator=((string *)&helpString,(string *)&local_258);
              std::__cxx11::string::~string((string *)&local_258);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&error,"HELPSTRING",(allocator<char> *)&oldcwd);
              CacheEntry::SetProperty(&e,(string *)&error,helpString._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&error);
            }
            bVar2 = ReadPropertyEntry(this,&entryKey,&e);
            if (!bVar2) {
              e.Initialized = true;
              this_00 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                        ::operator[](&this->Cache,&entryKey);
              CacheEntry::operator=(this_00,&e);
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
          poVar6 = std::operator<<((ostream *)&error,"Parse error in cache file ");
          poVar6 = std::operator<<(poVar6,(string *)&cacheFile);
          poVar6 = std::operator<<(poVar6," on line ");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(poVar6,". Offending entry: ");
          std::operator<<(poVar6,__s._M_p);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(&oldcwd);
          std::__cxx11::string::~string((string *)&oldcwd);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
        }
LAB_0031ce52:
        CacheEntry::~CacheEntry(&e);
        std::__cxx11::string::~string((string *)&helpString);
      }
      this->CacheMajorVersion = 0;
      this->CacheMinorVersion = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&error,"CMAKE_CACHE_MAJOR_VERSION",(allocator<char> *)&e);
      cVar7 = GetInitializedCacheValue(this,(string *)&error);
      std::__cxx11::string::~string((string *)&error);
      if (cVar7.Value == (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,"CMAKE_CACHE_MINOR_VERSION",(allocator<char> *)&e);
        AddCacheEntry(this,(string *)&error,"0",
                      "Minor version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&error);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,"CMAKE_CACHE_MAJOR_VERSION",(allocator<char> *)&e);
        AddCacheEntry(this,(string *)&error,"0",
                      "Major version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&error);
      }
      else {
        e.Value._M_dataplus._M_p = e.Value._M_dataplus._M_p & 0xffffffff00000000;
        iVar3 = __isoc99_sscanf(((cVar7.Value)->_M_dataplus)._M_p,"%u");
        if (iVar3 == 1) {
          this->CacheMajorVersion = (uint)e.Value._M_dataplus._M_p;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,"CMAKE_CACHE_MINOR_VERSION",(allocator<char> *)&oldcwd);
        cVar7 = GetInitializedCacheValue(this,(string *)&error);
        std::__cxx11::string::~string((string *)&error);
        if (cVar7.Value != (string *)0x0) {
          iVar3 = __isoc99_sscanf(((cVar7.Value)->_M_dataplus)._M_p,"%u",&e);
          if (iVar3 == 1) {
            this->CacheMinorVersion = (uint)e.Value._M_dataplus._M_p;
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&error,"CMAKE_CACHEFILE_DIR",(allocator<char> *)&e);
      cVar7 = GetInitializedCacheValue(this,(string *)&error);
      std::__cxx11::string::~string((string *)&error);
      if (internal && cVar7.Value != (string *)0x0) {
        std::__cxx11::string::string((string *)&e,(string *)path);
        std::__cxx11::string::string((string *)&oldcwd,(string *)cVar7.Value);
        cmsys::SystemTools::ConvertToUnixSlashes(&e.Value);
        std::__cxx11::string::append((char *)&e);
        std::__cxx11::string::append((char *)&oldcwd);
        bVar2 = cmsys::SystemTools::SameFile(&oldcwd,&e.Value);
        if (!bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&error,"CMAKE_CACHEFILE_DIR",(allocator<char> *)&helpString);
          cVar7 = GetInitializedCacheValue(this,(string *)&error);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
          poVar6 = std::operator<<((ostream *)&error,"The current CMakeCache.txt directory ");
          poVar6 = std::operator<<(poVar6,(string *)&e);
          poVar6 = std::operator<<(poVar6," is different than the directory ");
          if (cVar7.Value == (string *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&helpString,"",(allocator<char> *)&local_258);
          }
          else {
            std::__cxx11::string::string((string *)&helpString,(string *)cVar7.Value);
          }
          poVar6 = std::operator<<(poVar6,(string *)&helpString);
          std::operator<<(poVar6,
                          " where CMakeCache.txt was created. This may result in binaries being created in the wrong place. If you are not sure, reedit the CMakeCache.txt"
                         );
          std::__cxx11::string::~string((string *)&helpString);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(&helpString);
          std::__cxx11::string::~string((string *)&helpString);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
        }
        std::__cxx11::string::~string((string *)&oldcwd);
        std::__cxx11::string::~string((string *)&e);
      }
      this->CacheLoaded = true;
      std::__cxx11::string::~string((string *)&entryKey);
      std::__cxx11::string::~string((string *)&buffer);
    }
    std::ifstream::~ifstream(&fin);
  }
  else {
    CleanCMakeFiles(this_01,path);
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&cacheFile);
  return bVar1;
}

Assistant:

bool cmCacheManager::LoadCache(const std::string& path, bool internal,
                               std::set<std::string>& excludes,
                               std::set<std::string>& includes)
{
  std::string cacheFile = cmStrCat(path, "/CMakeCache.txt");
  // clear the old cache, if we are reading in internal values
  if (internal) {
    this->Cache.clear();
  }
  if (!cmSystemTools::FileExists(cacheFile)) {
    this->CleanCMakeFiles(path);
    return false;
  }

  cmsys::ifstream fin(cacheFile.c_str());
  if (!fin) {
    return false;
  }
  const char* realbuffer;
  std::string buffer;
  std::string entryKey;
  unsigned int lineno = 0;
  while (fin) {
    // Format is key:type=value
    std::string helpString;
    CacheEntry e;
    cmSystemTools::GetLineFromStream(fin, buffer);
    lineno++;
    realbuffer = buffer.c_str();
    while (*realbuffer != '0' &&
           (*realbuffer == ' ' || *realbuffer == '\t' || *realbuffer == '\r' ||
            *realbuffer == '\n')) {
      if (*realbuffer == '\n') {
        lineno++;
      }
      realbuffer++;
    }
    // skip blank lines and comment lines
    if (realbuffer[0] == '#' || realbuffer[0] == 0) {
      continue;
    }
    while (realbuffer[0] == '/' && realbuffer[1] == '/') {
      if ((realbuffer[2] == '\\') && (realbuffer[3] == 'n')) {
        helpString += '\n';
        helpString += &realbuffer[4];
      } else {
        helpString += &realbuffer[2];
      }
      cmSystemTools::GetLineFromStream(fin, buffer);
      lineno++;
      realbuffer = buffer.c_str();
      if (!fin) {
        continue;
      }
    }
    e.SetProperty("HELPSTRING", helpString.c_str());
    if (cmState::ParseCacheEntry(realbuffer, entryKey, e.Value, e.Type)) {
      if (excludes.find(entryKey) == excludes.end()) {
        // Load internal values if internal is set.
        // If the entry is not internal to the cache being loaded
        // or if it is in the list of internal entries to be
        // imported, load it.
        if (internal || (e.Type != cmStateEnums::INTERNAL) ||
            (includes.find(entryKey) != includes.end())) {
          // If we are loading the cache from another project,
          // make all loaded entries internal so that it is
          // not visible in the gui
          if (!internal) {
            e.Type = cmStateEnums::INTERNAL;
            helpString = cmStrCat("DO NOT EDIT, ", entryKey,
                                  " loaded from external file.  "
                                  "To change this value edit this file: ",
                                  path, "/CMakeCache.txt");
            e.SetProperty("HELPSTRING", helpString.c_str());
          }
          if (!this->ReadPropertyEntry(entryKey, e)) {
            e.Initialized = true;
            this->Cache[entryKey] = e;
          }
        }
      }
    } else {
      std::ostringstream error;
      error << "Parse error in cache file " << cacheFile << " on line "
            << lineno << ". Offending entry: " << realbuffer;
      cmSystemTools::Error(error.str());
    }
  }
  this->CacheMajorVersion = 0;
  this->CacheMinorVersion = 0;
  if (cmValue cmajor =
        this->GetInitializedCacheValue("CMAKE_CACHE_MAJOR_VERSION")) {
    unsigned int v = 0;
    if (sscanf(cmajor->c_str(), "%u", &v) == 1) {
      this->CacheMajorVersion = v;
    }
    if (cmValue cminor =
          this->GetInitializedCacheValue("CMAKE_CACHE_MINOR_VERSION")) {
      if (sscanf(cminor->c_str(), "%u", &v) == 1) {
        this->CacheMinorVersion = v;
      }
    }
  } else {
    // CMake version not found in the list file.
    // Set as version 0.0
    this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", "0",
                        "Minor version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", "0",
                        "Major version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
  }
  // check to make sure the cache directory has not
  // been moved
  cmValue oldDir = this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
  if (internal && oldDir) {
    std::string currentcwd = path;
    std::string oldcwd = *oldDir;
    cmSystemTools::ConvertToUnixSlashes(currentcwd);
    currentcwd += "/CMakeCache.txt";
    oldcwd += "/CMakeCache.txt";
    if (!cmSystemTools::SameFile(oldcwd, currentcwd)) {
      cmValue dir = this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
      std::ostringstream message;
      message << "The current CMakeCache.txt directory " << currentcwd
              << " is different than the directory " << (dir ? *dir : "")
              << " where CMakeCache.txt was created. This may result "
                 "in binaries being created in the wrong place. If you "
                 "are not sure, reedit the CMakeCache.txt";
      cmSystemTools::Error(message.str());
    }
  }
  this->CacheLoaded = true;
  return true;
}